

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.h
# Opt level: O0

void __thiscall Assimp::XGLImporter::TempScope::dismiss(TempScope *this)

{
  TempScope *this_local;
  
  this->light = (aiLight *)0x0;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::clear(&this->meshes_linear);
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::clear(&this->materials_linear);
  std::
  multimap<unsigned_int,_aiMesh_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMesh_*>_>_>
  ::clear(&this->meshes);
  std::
  map<unsigned_int,_aiMaterial_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMaterial_*>_>_>
  ::clear(&this->materials);
  return;
}

Assistant:

void dismiss() {
            light = NULL;
            meshes_linear.clear();
            materials_linear.clear();
            meshes.clear();
            materials.clear();
        }